

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SpecparamDeclarationSyntax *pSVar1;
  Token TVar2;
  Token TVar3;
  BumpAllocator *unaff_retaddr;
  BumpAllocator *in_stack_00000058;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000060;
  BumpAllocator *in_stack_000000f8;
  SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax> *in_stack_00000100;
  BumpAllocator *in_stack_ffffffffffffffa8;
  Token *args_1;
  
  args_1 = (Token *)__child_stack;
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000060,in_stack_00000058);
  TVar2 = parsing::Token::deepClone((Token *)in_stack_00000100,in_stack_000000f8);
  not_null<slang::syntax::ImplicitTypeSyntax_*>::operator*
            ((not_null<slang::syntax::ImplicitTypeSyntax_*> *)0x77bfbb);
  deepClone<slang::syntax::ImplicitTypeSyntax>
            ((ImplicitTypeSyntax *)__child_stack,in_stack_ffffffffffffffa8);
  deepClone<slang::syntax::SpecparamDeclaratorSyntax>(in_stack_00000100,in_stack_000000f8);
  TVar3 = parsing::Token::deepClone((Token *)in_stack_00000100,in_stack_000000f8);
  pSVar1 = BumpAllocator::
           emplace<slang::syntax::SpecparamDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::ImplicitTypeSyntax&,slang::syntax::SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>&,slang::parsing::Token>
                     (unaff_retaddr,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__fn,
                      args_1,(ImplicitTypeSyntax *)TVar2.info,TVar2._0_8_,(Token *)TVar3.info);
  return (int)pSVar1;
}

Assistant:

static SyntaxNode* clone(const SpecparamDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<SpecparamDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        *deepClone<ImplicitTypeSyntax>(*node.type, alloc),
        *deepClone(node.declarators, alloc),
        node.semi.deepClone(alloc)
    );
}